

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::SpecConstantTest::initPrograms
          (SpecConstantTest *this,SourceCollections *programCollection)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_00;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_01;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_02;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_03;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_04;
  bool bVar4;
  string local_f40;
  ShaderSource local_f20;
  allocator<char> local_ef1;
  string local_ef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0;
  string local_eb0;
  string local_e90;
  ostringstream local_e70 [8];
  ostringstream src_5;
  string local_cf8;
  ShaderSource local_cd8;
  allocator<char> local_ca9;
  string local_ca8;
  byte local_c82;
  allocator<char> local_c81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c80;
  byte local_c5a;
  allocator<char> local_c59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c58;
  byte local_c32;
  allocator<char> local_c31;
  string local_c30;
  byte local_c0a;
  allocator<char> local_c09;
  string local_c08;
  ostringstream local_be8 [8];
  ostringstream src_4;
  undefined1 local_a68 [7];
  bool useSpecConst_4;
  ShaderSource local_a48;
  allocator<char> local_a19;
  string local_a18;
  byte local_9f2;
  allocator<char> local_9f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  byte local_9ca;
  allocator<char> local_9c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  byte local_9a2;
  allocator<char> local_9a1;
  string local_9a0;
  byte local_97a;
  allocator<char> local_979;
  string local_978;
  ostringstream local_958 [8];
  ostringstream src_3;
  undefined1 local_7d8 [7];
  bool useSpecConst_3;
  ShaderSource local_7b8;
  allocator<char> local_789;
  string local_788;
  byte local_762;
  allocator<char> local_761;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  byte local_73a;
  allocator<char> local_739;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  byte local_712;
  allocator<char> local_711;
  string local_710;
  byte local_6ea;
  allocator<char> local_6e9;
  string local_6e8;
  ostringstream local_6c8 [8];
  ostringstream src_2;
  undefined1 local_548 [7];
  bool useSpecConst_2;
  ShaderSource local_528;
  allocator<char> local_4f9;
  string local_4f8;
  byte local_4d2;
  allocator<char> local_4d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  byte local_4aa;
  allocator<char> local_4a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  byte local_482;
  allocator<char> local_481;
  string local_480;
  byte local_45a;
  allocator<char> local_459;
  string local_458;
  ostringstream local_438 [8];
  ostringstream src_1;
  undefined1 local_2b8 [7];
  bool useSpecConst_1;
  ShaderSource local_298;
  allocator<char> local_269;
  string local_268;
  byte local_242;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  byte local_21a;
  allocator<char> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  byte local_1f2;
  allocator<char> local_1f1;
  string local_1f0;
  byte local_1ca;
  allocator<char> local_1c9;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream src;
  VkShaderStageFlagBits local_1c;
  bool useSpecConst;
  VkShaderStageFlags requiredStages;
  SourceCollections *programCollection_local;
  SpecConstantTest *this_local;
  
  local_1c = this->m_stage;
  if ((local_1c & VK_SHADER_STAGE_ALL_GRAPHICS) != 0) {
    local_1c = local_1c | (VK_SHADER_STAGE_FRAGMENT_BIT|VK_SHADER_STAGE_VERTEX_BIT);
  }
  if ((local_1c &
      (VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)) != 0)
  {
    local_1c = local_1c |
               (VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT
               );
  }
  if ((local_1c & VK_SHADER_STAGE_VERTEX_BIT) != 0) {
    bVar4 = this->m_stage != VK_SHADER_STAGE_VERTEX_BIT;
    std::__cxx11::ostringstream::ostringstream(local_198);
    pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar2 = std::operator<<((ostream *)local_198,pcVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) in highp vec4 position;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"out ");
    poVar2 = std::operator<<(poVar2,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar2 = std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(poVar2,"\n");
    local_1ca = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_1ca = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_1c9);
    }
    else {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                (&local_1c8,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,specConstants)
      ;
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
    local_1f2 = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_1f2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",&local_1f1);
    }
    else {
      generateSSBOCode(&local_1f0,&(this->m_caseDef).ssboCode);
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
    local_21a = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_21a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"",&local_219);
    }
    else {
      std::operator+(&local_218,&(this->m_caseDef).globalCode,"\n");
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_218);
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    local_242 = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_242 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"",&local_241);
    }
    else {
      std::operator+(&local_240,&(this->m_caseDef).mainCode,"\n");
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_240);
    poVar2 = std::operator<<(poVar2,"    gl_Position = position;\n");
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_240);
    if ((local_242 & 1) != 0) {
      std::allocator<char>::~allocator(&local_241);
    }
    std::__cxx11::string::~string((string *)&local_218);
    if ((local_21a & 1) != 0) {
      std::allocator<char>::~allocator(&local_219);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
    if ((local_1f2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1f1);
    }
    std::__cxx11::string::~string((string *)&local_1c8);
    if ((local_1ca & 1) != 0) {
      std::allocator<char>::~allocator(&local_1c9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"vert",&local_269);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_268);
    std::__cxx11::ostringstream::str();
    glu::VertexSource::VertexSource((VertexSource *)&local_298,(string *)local_2b8);
    glu::ProgramSources::operator<<(pPVar3,&local_298);
    glu::VertexSource::~VertexSource((VertexSource *)&local_298);
    std::__cxx11::string::~string((string *)local_2b8);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  if ((local_1c & VK_SHADER_STAGE_FRAGMENT_BIT) != 0) {
    bVar4 = this->m_stage != VK_SHADER_STAGE_FRAGMENT_BIT;
    std::__cxx11::ostringstream::ostringstream(local_438);
    pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar2 = std::operator<<((ostream *)local_438,pcVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec4 fragColor;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    local_45a = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_45a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"",&local_459);
    }
    else {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                (&local_458,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants_00);
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_458);
    local_482 = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_482 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"",&local_481);
    }
    else {
      generateSSBOCode(&local_480,&(this->m_caseDef).ssboCode);
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_480);
    local_4aa = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_4aa = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"",&local_4a9);
    }
    else {
      std::operator+(&local_4a8,&(this->m_caseDef).globalCode,"\n");
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_4a8);
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    local_4d2 = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_4d2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"",&local_4d1);
    }
    else {
      std::operator+(&local_4d0,&(this->m_caseDef).mainCode,"\n");
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_4d0);
    poVar2 = std::operator<<(poVar2,"    fragColor = vec4(1.0, 1.0, 0.0, 1.0);\n");
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_4d0);
    if ((local_4d2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_4d1);
    }
    std::__cxx11::string::~string((string *)&local_4a8);
    if ((local_4aa & 1) != 0) {
      std::allocator<char>::~allocator(&local_4a9);
    }
    std::__cxx11::string::~string((string *)&local_480);
    if ((local_482 & 1) != 0) {
      std::allocator<char>::~allocator(&local_481);
    }
    std::__cxx11::string::~string((string *)&local_458);
    if ((local_45a & 1) != 0) {
      std::allocator<char>::~allocator(&local_459);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"frag",&local_4f9);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_4f8);
    std::__cxx11::ostringstream::str();
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_528,(string *)local_548);
    glu::ProgramSources::operator<<(pPVar3,&local_528);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_528);
    std::__cxx11::string::~string((string *)local_548);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
    std::__cxx11::ostringstream::~ostringstream(local_438);
  }
  if ((local_1c & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0) {
    bVar4 = this->m_stage != VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
    std::__cxx11::ostringstream::ostringstream(local_6c8);
    pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar2 = std::operator<<((ostream *)local_6c8,pcVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(vertices = 3) out;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"in ");
    poVar2 = std::operator<<(poVar2,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar2 = std::operator<<(poVar2," gl_in[gl_MaxPatchVertices];\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"out ");
    poVar2 = std::operator<<(poVar2,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar2 = std::operator<<(poVar2," gl_out[];\n");
    poVar2 = std::operator<<(poVar2,"\n");
    local_6ea = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_6ea = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"",&local_6e9);
    }
    else {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                (&local_6e8,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants_01);
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_6e8);
    local_712 = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_712 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"",&local_711);
    }
    else {
      generateSSBOCode(&local_710,&(this->m_caseDef).ssboCode);
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_710);
    local_73a = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_73a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"",&local_739);
    }
    else {
      std::operator+(&local_738,&(this->m_caseDef).globalCode,"\n");
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_738);
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    local_762 = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_762 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_760,"",&local_761);
    }
    else {
      std::operator+(&local_760,&(this->m_caseDef).mainCode,"\n");
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_760);
    poVar2 = std::operator<<(poVar2,
                             "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                            );
    poVar2 = std::operator<<(poVar2,"    if (gl_InvocationID == 0)\n");
    poVar2 = std::operator<<(poVar2,"    {\n");
    poVar2 = std::operator<<(poVar2,"        gl_TessLevelInner[0] = 3;\n");
    poVar2 = std::operator<<(poVar2,"        gl_TessLevelOuter[0] = 2;\n");
    poVar2 = std::operator<<(poVar2,"        gl_TessLevelOuter[1] = 2;\n");
    poVar2 = std::operator<<(poVar2,"        gl_TessLevelOuter[2] = 2;\n");
    poVar2 = std::operator<<(poVar2,"    }\n");
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_760);
    if ((local_762 & 1) != 0) {
      std::allocator<char>::~allocator(&local_761);
    }
    std::__cxx11::string::~string((string *)&local_738);
    if ((local_73a & 1) != 0) {
      std::allocator<char>::~allocator(&local_739);
    }
    std::__cxx11::string::~string((string *)&local_710);
    if ((local_712 & 1) != 0) {
      std::allocator<char>::~allocator(&local_711);
    }
    std::__cxx11::string::~string((string *)&local_6e8);
    if ((local_6ea & 1) != 0) {
      std::allocator<char>::~allocator(&local_6e9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"tesc",&local_789);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_788);
    std::__cxx11::ostringstream::str();
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_7b8,(string *)local_7d8);
    glu::ProgramSources::operator<<(pPVar3,&local_7b8);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_7b8);
    std::__cxx11::string::~string((string *)local_7d8);
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator(&local_789);
    std::__cxx11::ostringstream::~ostringstream(local_6c8);
  }
  if ((local_1c & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0) {
    bVar4 = this->m_stage != VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;
    std::__cxx11::ostringstream::ostringstream(local_958);
    pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar2 = std::operator<<((ostream *)local_958,pcVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(triangles, equal_spacing, ccw) in;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"in ");
    poVar2 = std::operator<<(poVar2,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar2 = std::operator<<(poVar2," gl_in[gl_MaxPatchVertices];\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"out ");
    poVar2 = std::operator<<(poVar2,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar2 = std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(poVar2,"\n");
    local_97a = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_97a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_978,"",&local_979);
    }
    else {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                (&local_978,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants_02);
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_978);
    local_9a2 = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_9a2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"",&local_9a1);
    }
    else {
      generateSSBOCode(&local_9a0,&(this->m_caseDef).ssboCode);
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_9a0);
    local_9ca = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_9ca = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c8,"",&local_9c9);
    }
    else {
      std::operator+(&local_9c8,&(this->m_caseDef).globalCode,"\n");
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_9c8);
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    local_9f2 = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_9f2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f0,"",&local_9f1);
    }
    else {
      std::operator+(&local_9f0,&(this->m_caseDef).mainCode,"\n");
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_9f0);
    poVar2 = std::operator<<(poVar2,"    vec3 p0 = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n");
    poVar2 = std::operator<<(poVar2,"    vec3 p1 = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n");
    poVar2 = std::operator<<(poVar2,"    vec3 p2 = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(p0 + p1 + p2, 1.0);\n");
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_9f0);
    if ((local_9f2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_9f1);
    }
    std::__cxx11::string::~string((string *)&local_9c8);
    if ((local_9ca & 1) != 0) {
      std::allocator<char>::~allocator(&local_9c9);
    }
    std::__cxx11::string::~string((string *)&local_9a0);
    if ((local_9a2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_9a1);
    }
    std::__cxx11::string::~string((string *)&local_978);
    if ((local_97a & 1) != 0) {
      std::allocator<char>::~allocator(&local_979);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"tese",&local_a19);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_a18);
    std::__cxx11::ostringstream::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_a48,(string *)local_a68);
    glu::ProgramSources::operator<<(pPVar3,&local_a48);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_a48);
    std::__cxx11::string::~string((string *)local_a68);
    std::__cxx11::string::~string((string *)&local_a18);
    std::allocator<char>::~allocator(&local_a19);
    std::__cxx11::ostringstream::~ostringstream(local_958);
  }
  if ((local_1c & VK_SHADER_STAGE_GEOMETRY_BIT) != 0) {
    bVar4 = this->m_stage != VK_SHADER_STAGE_GEOMETRY_BIT;
    std::__cxx11::ostringstream::ostringstream(local_be8);
    pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar2 = std::operator<<((ostream *)local_be8,pcVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(triangles) in;\n");
    poVar2 = std::operator<<(poVar2,"layout(triangle_strip, max_vertices = 3) out;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"in ");
    poVar2 = std::operator<<(poVar2,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar2 = std::operator<<(poVar2," gl_in[];\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"out ");
    poVar2 = std::operator<<(poVar2,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar2 = std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(poVar2,"\n");
    local_c0a = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_c0a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c08,"",&local_c09);
    }
    else {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                (&local_c08,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants_03);
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_c08);
    local_c32 = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_c32 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c30,"",&local_c31);
    }
    else {
      generateSSBOCode(&local_c30,&(this->m_caseDef).ssboCode);
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_c30);
    local_c5a = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_c5a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c58,"",&local_c59);
    }
    else {
      std::operator+(&local_c58,&(this->m_caseDef).globalCode,"\n");
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_c58);
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    local_c82 = 0;
    if (bVar4) {
      std::allocator<char>::allocator();
      local_c82 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c80,"",&local_c81);
    }
    else {
      std::operator+(&local_c80,&(this->m_caseDef).mainCode,"\n");
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_c80);
    poVar2 = std::operator<<(poVar2,"    gl_Position = gl_in[0].gl_Position;\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = gl_in[1].gl_Position;\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = gl_in[2].gl_Position;\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    EndPrimitive();\n");
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_c80);
    if ((local_c82 & 1) != 0) {
      std::allocator<char>::~allocator(&local_c81);
    }
    std::__cxx11::string::~string((string *)&local_c58);
    if ((local_c5a & 1) != 0) {
      std::allocator<char>::~allocator(&local_c59);
    }
    std::__cxx11::string::~string((string *)&local_c30);
    if ((local_c32 & 1) != 0) {
      std::allocator<char>::~allocator(&local_c31);
    }
    std::__cxx11::string::~string((string *)&local_c08);
    if ((local_c0a & 1) != 0) {
      std::allocator<char>::~allocator(&local_c09);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ca8,"geom",&local_ca9);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_ca8);
    std::__cxx11::ostringstream::str();
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_cd8,&local_cf8);
    glu::ProgramSources::operator<<(pPVar3,&local_cd8);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_cd8);
    std::__cxx11::string::~string((string *)&local_cf8);
    std::__cxx11::string::~string((string *)&local_ca8);
    std::allocator<char>::~allocator(&local_ca9);
    std::__cxx11::ostringstream::~ostringstream(local_be8);
  }
  if ((local_1c & VK_SHADER_STAGE_COMPUTE_BIT) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_e70);
    pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar2 = std::operator<<((ostream *)local_e70,pcVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\n");
    pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
              (&local_e90,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,specConstants_04
              );
    poVar2 = std::operator<<(poVar2,(string *)&local_e90);
    generateSSBOCode(&local_eb0,&(this->m_caseDef).ssboCode);
    poVar2 = std::operator<<(poVar2,(string *)&local_eb0);
    std::operator+(&local_ed0,&(this->m_caseDef).globalCode,"\n");
    poVar2 = std::operator<<(poVar2,(string *)&local_ed0);
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,(string *)&(this->m_caseDef).mainCode);
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_ed0);
    std::__cxx11::string::~string((string *)&local_eb0);
    std::__cxx11::string::~string((string *)&local_e90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ef0,"comp",&local_ef1);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_ef0);
    std::__cxx11::ostringstream::str();
    glu::ComputeSource::ComputeSource((ComputeSource *)&local_f20,&local_f40);
    glu::ProgramSources::operator<<(pPVar3,&local_f20);
    glu::ComputeSource::~ComputeSource((ComputeSource *)&local_f20);
    std::__cxx11::string::~string((string *)&local_f40);
    std::__cxx11::string::~string((string *)&local_ef0);
    std::allocator<char>::~allocator(&local_ef1);
    std::__cxx11::ostringstream::~ostringstream(local_e70);
  }
  return;
}

Assistant:

void SpecConstantTest::initPrograms (SourceCollections& programCollection) const
{
	// Always add vertex and fragment to graphics stages
	VkShaderStageFlags requiredStages = m_stage;

	if (requiredStages & VK_SHADER_STAGE_ALL_GRAPHICS)
		requiredStages |= VK_SHADER_STAGE_VERTEX_BIT | VK_SHADER_STAGE_FRAGMENT_BIT;

	if (requiredStages & (VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT))
		requiredStages |= VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;

	// Either graphics or compute must be defined, but not both
	DE_ASSERT(((requiredStages & VK_SHADER_STAGE_ALL_GRAPHICS) != 0) != ((requiredStages & VK_SHADER_STAGE_COMPUTE_BIT) != 0));

	if (requiredStages & VK_SHADER_STAGE_VERTEX_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_VERTEX_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(location = 0) in highp vec4 position;\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    gl_Position = position;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_FRAGMENT_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_FRAGMENT_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(location = 0) out highp vec4 fragColor;\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    fragColor = vec4(1.0, 1.0, 0.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(vertices = 3) out;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << " gl_out[];\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< "    if (gl_InvocationID == 0)\n"
			<< "    {\n"
			<< "        gl_TessLevelInner[0] = 3;\n"
			<< "        gl_TessLevelOuter[0] = 2;\n"
			<< "        gl_TessLevelOuter[1] = 2;\n"
			<< "        gl_TessLevelOuter[2] = 2;\n"
			<< "    }\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(triangles, equal_spacing, ccw) in;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    vec3 p0 = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n"
			<< "    vec3 p1 = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n"
			<< "    vec3 p2 = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n"
			<< "    gl_Position = vec4(p0 + p1 + p2, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_GEOMETRY_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_GEOMETRY_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = 3) out;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    gl_Position = gl_in[0].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = gl_in[1].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = gl_in[2].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    EndPrimitive();\n"
			<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_COMPUTE_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			// Don't define work group size, use the default or specialization constants
			<< "\n"
			<< generateSpecConstantCode(m_caseDef.specConstants)
			<< generateSSBOCode(m_caseDef.ssboCode)
			<< m_caseDef.globalCode + "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< m_caseDef.mainCode
			<< "}\n";

		programCollection.glslSources.add("comp") << glu::ComputeSource(src.str());
	}
}